

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gltf.cpp
# Opt level: O1

void vera::extractMesh(Model *_model,Mesh *_mesh,mat4 _matrix,Scene *_scene,bool _verbose)

{
  Accessor *this;
  BufferView *bufferViewObject;
  int iVar1;
  pointer pPVar2;
  pointer pAVar3;
  pointer pBVar4;
  pointer pBVar5;
  bool bVar6;
  uint32_t byteStride;
  int iVar7;
  ostream *poVar8;
  long lVar9;
  long *plVar10;
  _Base_ptr p_Var11;
  Material *_mat;
  Model *this_00;
  mapped_type *ppMVar12;
  undefined8 uVar13;
  uint uVar14;
  undefined7 in_register_00000009;
  bool _verbose_00;
  ulong uVar15;
  ulong uVar16;
  void *pvVar17;
  float fVar18;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  vec4 tan;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_228;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_224;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_220;
  Model *local_218;
  _Base_ptr local_210;
  uint local_204;
  float local_200;
  float local_1fc;
  float local_1f8;
  float local_1f4;
  float local_1f0;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 local_1ec;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 local_1e8;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 local_1e4;
  Scene *local_1e0;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined1 local_1c8 [8];
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aStack_1c0;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aStack_1bc;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  ModelsMap *local_1a8;
  Mesh *local_1a0;
  pointer local_198;
  ulong local_190;
  _Base_ptr local_188;
  Mesh mesh;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_88;
  
  uVar14 = (uint)CONCAT71(in_register_00000009,_verbose);
  uVar15 = CONCAT71(in_register_00000009,_verbose) & 0xffffffff;
  local_218 = _model;
  local_1e0 = _scene;
  if (uVar14 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Parsing Mesh ",0xf);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(_mesh->name)._M_dataplus._M_p,
                        (_mesh->name)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  if ((_mesh->primitives).
      super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (_mesh->primitives).
      super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_1f8 = _matrix.value[1].field_1.y * _matrix.value[2].field_2.z -
                _matrix.value[1].field_2.z * _matrix.value[2].field_1.y;
    fVar23 = _matrix.value[0].field_1.y * _matrix.value[2].field_2.z -
             _matrix.value[0].field_2.z * _matrix.value[2].field_1.y;
    local_1fc = _matrix.value[0].field_1.y * _matrix.value[1].field_2.z -
                _matrix.value[0].field_2.z * _matrix.value[1].field_1.y;
    fVar21 = 1.0 / (_matrix.value[2].field_0.x * local_1fc +
                   (_matrix.value[0].field_0.x * local_1f8 - fVar23 * _matrix.value[1].field_0.x));
    local_1f8 = local_1f8 * fVar21;
    local_200 = (_matrix.value[1].field_0.x * _matrix.value[2].field_1.y -
                _matrix.value[1].field_1.y * _matrix.value[2].field_0.x) * fVar21;
    local_1f4 = (_matrix.value[2].field_2.z * _matrix.value[0].field_0.x -
                _matrix.value[0].field_2.z * _matrix.value[2].field_0.x) * fVar21;
    local_1fc = local_1fc * fVar21;
    local_1f0 = (_matrix.value[0].field_0.x * _matrix.value[1].field_1.y -
                _matrix.value[0].field_1.y * _matrix.value[1].field_0.x) * fVar21;
    local_1a8 = &local_1e0->models;
    uVar16 = 0;
    local_204 = uVar14;
    local_1a0 = _mesh;
    do {
      if ((char)uVar15 != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"   primitive ",0xd);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"/",1);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      pPVar2 = (_mesh->primitives).
               super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>._M_impl
               .super__Vector_impl_data._M_start;
      Mesh::Mesh(&mesh);
      lVar9 = (long)pPVar2[uVar16].indices;
      if (-1 < lVar9) {
        extractIndices(local_218,
                       (local_218->accessors).
                       super__Vector_base<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar9,&mesh);
      }
      local_198 = pPVar2 + uVar16;
      mesh.m_drawMode = TRIANGLES;
      if ((ulong)(uint)local_198->mode < 7) {
        mesh.m_drawMode = *(DrawMode *)(&DAT_0031db18 + (ulong)(uint)local_198->mode * 4);
      }
      p_Var11 = *(_Base_ptr *)((long)&(local_198->attributes)._M_t._M_impl + 0x18);
      local_188 = (_Base_ptr)((long)&(local_198->attributes)._M_t._M_impl + 8);
      local_190 = uVar16;
      if (p_Var11 != local_188) {
        do {
          pAVar3 = (local_218->accessors).
                   super__Vector_base<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pBVar4 = (local_218->bufferViews).
                   super__Vector_base<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          this = pAVar3 + (int)p_Var11[2]._M_color;
          iVar1 = pAVar3[(int)p_Var11[2]._M_color].bufferView;
          bufferViewObject = pBVar4 + iVar1;
          iVar1 = pBVar4[iVar1].buffer;
          pBVar5 = (local_218->buffers).
                   super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_210 = p_Var11;
          byteStride = tinygltf::Accessor::ByteStride(this,bufferViewObject);
          p_Var11 = local_210 + 1;
          iVar7 = std::__cxx11::string::compare((char *)p_Var11);
          if (iVar7 == 0) {
            if (this->count != 0) {
              local_1b8 = _matrix.value[0]._0_8_;
              uStack_1b0 = 0;
              local_1c8._4_4_ = _matrix.value[0].field_1;
              local_1c8._0_4_ = _matrix.value[0].field_1;
              aStack_1c0 = _matrix.value[0].field_1;
              aStack_1bc = _matrix.value[0].field_1;
              local_1d8 = _matrix.value[0].field_2;
              local_1e4 = _matrix.value[1].field_2;
              local_1e8 = _matrix.value[2].field_2;
              local_1ec = _matrix.value[3].field_2;
              pvVar17 = (void *)0x0;
              do {
                tan.field_0.x = 1.0;
                tan.field_1.y = 1.0;
                tan.field_2.z = 1.0;
                tan.field_3.w = 1.0;
                uVar15 = this->byteOffset + bufferViewObject->byteOffset;
                lVar9 = *(long *)&pBVar5[iVar1].data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data;
                if ((ulong)((long)*(pointer *)
                                   ((long)&pBVar5[iVar1].data.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl + 8) - lVar9) <= uVar15) {
                  std::__throw_out_of_range_fmt
                            (
                            "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            );
                  goto LAB_00295a0a;
                }
                extractVertexData((uint32_t)pvVar17,(uint8_t *)(lVar9 + uVar15),this->componentType,
                                  this->type,false,byteStride,(float *)&tan,'\x03');
                local_88 = _matrix.value[3].field_0;
                local_220.z = tan.field_3.w * local_1ec.z + tan.field_2.z * local_1e8.z +
                              tan.field_1.y * local_1e4.z + tan.field_0.x * local_1d8.z;
                aStack_224.y = tan.field_3.w * _matrix.value[3].field_1.y +
                               tan.field_2.z * _matrix.value[2].field_1.y +
                               tan.field_1.y * _matrix.value[1].field_1.y +
                               tan.field_0.x * (float)local_1c8._0_4_;
                local_228.x = tan.field_3.w * local_88.x +
                              tan.field_2.z * _matrix.value[2].field_0.x +
                              tan.field_1.y * _matrix.value[1].field_0.x +
                              tan.field_0.x * (float)local_1b8;
                Mesh::addVertex(&mesh,(vec3 *)&local_228);
                pvVar17 = (void *)((long)pvVar17 + 1);
              } while (pvVar17 < (void *)this->count);
            }
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)p_Var11);
            if (iVar7 == 0) {
              if (this->count != 0) {
                pvVar17 = (void *)0x0;
                do {
                  tan.field_0.x = 1.0;
                  tan.field_1.y = 1.0;
                  tan.field_2.z = 1.0;
                  tan.field_3.w = 1.0;
                  uVar15 = this->byteOffset + bufferViewObject->byteOffset;
                  lVar9 = *(long *)&pBVar5[iVar1].data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data;
                  if ((ulong)((long)*(pointer *)
                                     ((long)&pBVar5[iVar1].data.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl + 8) - lVar9) <= uVar15) goto LAB_00295a0a;
                  extractVertexData((uint32_t)pvVar17,(uint8_t *)(lVar9 + uVar15),
                                    this->componentType,this->type,false,byteStride,(float *)&tan,
                                    '\x04');
                  Mesh::addColor(&mesh,&tan);
                  pvVar17 = (void *)((long)pvVar17 + 1);
                } while (pvVar17 < (void *)this->count);
              }
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)p_Var11);
              if (iVar7 == 0) {
                if (this->count != 0) {
                  pvVar17 = (void *)0x0;
                  do {
                    uVar15 = this->byteOffset + bufferViewObject->byteOffset;
                    lVar9 = *(long *)&pBVar5[iVar1].data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data;
                    if ((ulong)((long)*(pointer *)
                                       ((long)&pBVar5[iVar1].data.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl + 8) - lVar9) <= uVar15) goto LAB_00295a18;
                    extractVertexData((uint32_t)pvVar17,(uint8_t *)(lVar9 + uVar15),
                                      this->componentType,this->type,false,byteStride,(float *)&tan,
                                      '\x03');
                    fVar22 = local_1fc * tan.field_2.z +
                             local_1f8 * tan.field_0.x + -fVar23 * fVar21 * tan.field_1.y;
                    aVar19.z = -(_matrix.value[1].field_2.z * _matrix.value[0].field_0.x -
                                _matrix.value[0].field_2.z * _matrix.value[1].field_0.x) * fVar21 *
                               tan.field_2.z +
                               -(_matrix.value[1].field_0.x * _matrix.value[2].field_2.z -
                                _matrix.value[1].field_2.z * _matrix.value[2].field_0.x) * fVar21 *
                               tan.field_0.x + local_1f4 * tan.field_1.y;
                    fVar20 = tan.field_2.z * local_1f0 +
                             tan.field_0.x * local_200 +
                             tan.field_1.y *
                             -(_matrix.value[2].field_1.y * _matrix.value[0].field_0.x -
                              _matrix.value[2].field_0.x * _matrix.value[0].field_1.y) * fVar21;
                    fVar18 = fVar20 * fVar20 + aVar19.z * aVar19.z + fVar22 * fVar22;
                    if (fVar18 < 0.0) {
                      local_1b8 = CONCAT44(local_1b8._4_4_,fVar20);
                      _local_1c8 = ZEXT416((uint)fVar22);
                      uStack_1d4 = 0x80000000;
                      uStack_1d0 = 0x80000000;
                      uStack_1cc = 0x80000000;
                      local_1d8.z = aVar19.z;
                      fVar18 = sqrtf(fVar18);
                      aVar19 = local_1d8;
                      fVar20 = (float)local_1b8;
                      fVar22 = (float)local_1c8._0_4_;
                    }
                    else {
                      fVar18 = SQRT(fVar18);
                    }
                    fVar18 = 1.0 / fVar18;
                    local_220.z = fVar18 * fVar20;
                    aStack_224.y = aVar19.z * fVar18;
                    local_228.x = fVar22 * fVar18;
                    Mesh::addNormal(&mesh,(vec3 *)&local_228);
                    pvVar17 = (void *)((long)pvVar17 + 1);
                  } while (pvVar17 < (void *)this->count);
                }
              }
              else {
                iVar7 = std::__cxx11::string::compare((char *)p_Var11);
                if (iVar7 == 0) {
                  if (this->count != 0) {
                    pvVar17 = (void *)0x0;
                    do {
                      uVar15 = this->byteOffset + bufferViewObject->byteOffset;
                      lVar9 = *(long *)&pBVar5[iVar1].data.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data;
                      if ((ulong)((long)*(pointer *)
                                         ((long)&pBVar5[iVar1].data.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl + 8) - lVar9) <= uVar15)
                      goto LAB_00295a26;
                      extractVertexData((uint32_t)pvVar17,(uint8_t *)(lVar9 + uVar15),
                                        this->componentType,this->type,false,byteStride,
                                        (float *)&tan,'\x02');
                      Mesh::addTexCoord(&mesh,(vec2 *)&tan);
                      pvVar17 = (void *)((long)pvVar17 + 1);
                    } while (pvVar17 < (void *)this->count);
                  }
                }
                else {
                  iVar7 = std::__cxx11::string::compare((char *)p_Var11);
                  if (iVar7 == 0) {
                    if (this->count != 0) {
                      pvVar17 = (void *)0x0;
                      do {
                        uVar15 = this->byteOffset + bufferViewObject->byteOffset;
                        lVar9 = *(long *)&pBVar5[iVar1].data.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data;
                        if ((ulong)((long)*(pointer *)
                                           ((long)&pBVar5[iVar1].data.
                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl + 8) - lVar9) <= uVar15)
                        goto LAB_00295a34;
                        extractVertexData((uint32_t)pvVar17,(uint8_t *)(lVar9 + uVar15),
                                          this->componentType,this->type,false,byteStride,
                                          (float *)&tan,'\x04');
                        Mesh::addTangent(&mesh,&tan);
                        pvVar17 = (void *)((long)pvVar17 + 1);
                      } while (pvVar17 < (void *)this->count);
                    }
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                    std::ostream::put(-0x28);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Attribute: ",0xb);
                    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,*(char **)(local_210 + 1),
                                        (long)local_210[1]._M_parent);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                    std::ostream::put((char)poVar8);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"  type        :",0xf);
                    plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->type);
                    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
                    std::ostream::put((char)plVar10);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"  component   :",0xf);
                    plVar10 = (long *)std::ostream::operator<<
                                                ((ostream *)&std::cout,this->componentType);
                    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
                    std::ostream::put((char)plVar10);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"  normalize   :",0xf);
                    poVar8 = std::ostream::_M_insert<bool>(true);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                    std::ostream::put((char)poVar8);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"  bufferView  :",0xf);
                    plVar10 = (long *)std::ostream::operator<<
                                                ((ostream *)&std::cout,this->bufferView);
                    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
                    std::ostream::put((char)plVar10);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"  byteOffset  :",0xf);
                    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                    std::ostream::put((char)poVar8);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"  count       :",0xf);
                    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                    std::ostream::put((char)poVar8);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"  byteStride  :",0xf);
                    plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,byteStride);
                    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
                    std::ostream::put((char)plVar10);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                    std::ostream::put(-0x28);
                    std::ostream::flush();
                  }
                }
              }
            }
          }
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(local_210);
        } while (p_Var11 != local_188);
      }
      uVar16 = local_190;
      pPVar2 = local_198;
      _mesh = local_1a0;
      uVar15 = (ulong)local_204;
      _verbose_00 = SUB41(local_204,0);
      if (_verbose_00 != false) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"    vertices = ",0xf);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"    colors   = ",0xf);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"    normals  = ",0xf);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"    uvs      = ",0xf);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"    indices  = ",0xf);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        if (mesh.m_drawMode == LINES) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"    lines    = ",0xf);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        }
        else {
          if (mesh.m_drawMode != TRIANGLES) goto LAB_0029588c;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"    triang.  = ",0xf);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        }
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
LAB_0029588c:
      if ((mesh.m_normals.
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           mesh.m_normals.
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         (bVar6 = Mesh::computeNormals(&mesh), (bVar6 & _verbose_00) == 1)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"    . Compute normals",0x15);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
      }
      bVar6 = Mesh::computeTangents(&mesh);
      if ((bVar6 & _verbose_00) == 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"    . Compute tangents",0x16);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
      }
      _mat = extractMaterial(local_218,
                             (local_218->materials).
                             super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>
                             ._M_impl.super__Vector_impl_data._M_start + pPVar2->material,local_1e0,
                             _verbose_00);
      this_00 = (Model *)operator_new(0x2d8);
      Model::Model(this_00,&_mesh->name,&mesh,_mat);
      ppMVar12 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
                 ::operator[](local_1a8,&_mesh->name);
      *ppMVar12 = this_00;
      Mesh::~Mesh(&mesh);
      uVar16 = uVar16 + 1;
    } while (uVar16 < (ulong)(((long)(_mesh->primitives).
                                     super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(_mesh->primitives).
                                     super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5) *
                             -0x71c71c71c71c71c7));
  }
  return;
LAB_00295a0a:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00295a18:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00295a26:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00295a34:
  uVar13 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  operator_delete(pvVar17);
  Mesh::~Mesh(&mesh);
  _Unwind_Resume(uVar13);
}

Assistant:

void extractMesh(const tinygltf::Model& _model, const tinygltf::Mesh& _mesh, glm::mat4 _matrix, Scene* _scene, bool _verbose) {
    if (_verbose)
        std::cout << "  Parsing Mesh " << _mesh.name << std::endl;

    glm::mat3 normalMatrix = glm::transpose(glm::inverse(glm::mat3(_matrix)));

    for (size_t i = 0; i < _mesh.primitives.size(); ++i) {
        if (_verbose)
            std::cout << "   primitive " << i + 1 << "/" << _mesh.primitives.size() << std::endl;

        const tinygltf::Primitive &primitive = _mesh.primitives[i];

        Mesh mesh;
        if (primitive.indices >= 0)
            extractIndices(_model, _model.accessors[primitive.indices], mesh);
        mesh.setDrawMode(extractMode(primitive));

        // Extract Vertex Data
        for (auto &attrib : primitive.attributes) {
            const tinygltf::Accessor &accessor = _model.accessors[attrib.second];
            const tinygltf::BufferView &bufferView = _model.bufferViews[accessor.bufferView];
            const tinygltf::Buffer &buffer = _model.buffers[bufferView.buffer];
            int byteStride = accessor.ByteStride(bufferView);

            if (attrib.first.compare("POSITION") == 0)  {
                for (size_t v = 0; v < accessor.count; v++) {
                    glm::vec4 pos = glm::vec4(1.0);
                    extractVertexData(v, &buffer.data.at(bufferView.byteOffset + accessor.byteOffset), accessor.componentType, accessor.type, accessor.normalized, byteStride, &pos[0], 3);
                    mesh.addVertex( glm::vec3(_matrix * pos) );
                }
            }

            else if (attrib.first.compare("COLOR_0") == 0)  {
                for (size_t v = 0; v < accessor.count; v++) {
                    glm::vec4 col = glm::vec4(1.0f);
                    extractVertexData(v, &buffer.data.at(bufferView.byteOffset + accessor.byteOffset), accessor.componentType, accessor.type, accessor.normalized, byteStride, &col[0], 4);
                    mesh.addColor(col);
                }
            }

            else if (attrib.first.compare("NORMAL") == 0)  {
                for (size_t v = 0; v < accessor.count; v++) {
                    glm::vec3 nor;
                    extractVertexData(v, &buffer.data.at(bufferView.byteOffset + accessor.byteOffset), accessor.componentType, accessor.type, accessor.normalized, byteStride, &nor[0], 3);
                    mesh.addNormal( normalize(normalMatrix * nor) );
                }
            }

            else if (attrib.first.compare("TEXCOORD_0") == 0)  {
                for (size_t v = 0; v < accessor.count; v++) {
                    glm::vec2 uv;
                    extractVertexData(v, &buffer.data.at(bufferView.byteOffset + accessor.byteOffset), accessor.componentType, accessor.type, accessor.normalized, byteStride, &uv[0], 2);
                    mesh.addTexCoord(uv);
                }
            }

            else if (attrib.first.compare("TANGENT") == 0)  {
                for (size_t v = 0; v < accessor.count; v++) {
                    glm::vec4 tan;
                    extractVertexData(v, &buffer.data.at(bufferView.byteOffset + accessor.byteOffset), accessor.componentType, accessor.type, accessor.normalized, byteStride, &tan[0], 4);
                    mesh.addTangent(tan);
                }
            }

            else {
                std::cout << " " << std::endl;
                std::cout << "Attribute: " << attrib.first << std::endl;
                std::cout << "  type        :" << accessor.type << std::endl;
                std::cout << "  component   :" << accessor.componentType << std::endl;
                std::cout << "  normalize   :" << accessor.normalized << std::endl;
                std::cout << "  bufferView  :" << accessor.bufferView << std::endl;
                std::cout << "  byteOffset  :" << accessor.byteOffset << std::endl;
                std::cout << "  count       :" << accessor.count << std::endl;
                std::cout << "  byteStride  :" << byteStride << std::endl;
                std::cout << " "<< std::endl;
            }
        }

        if (_verbose) {
            std::cout << "    vertices = " << mesh.getVertices().size() << std::endl;
            std::cout << "    colors   = " << mesh.getColors().size() << std::endl;
            std::cout << "    normals  = " << mesh.getNormals().size() << std::endl;
            std::cout << "    uvs      = " << mesh.getTexCoords().size() << std::endl;
            std::cout << "    indices  = " << mesh.getIndices().size() << std::endl;

            if (mesh.getDrawMode() == GL_TRIANGLES) {
                std::cout << "    triang.  = " << mesh.getIndices().size()/3 << std::endl;
            }
            else if (mesh.getDrawMode() == GL_LINES ) {
                std::cout << "    lines    = " << mesh.getIndices().size()/2 << std::endl;
            }
        }

        if ( !mesh.haveNormals() )
            if ( mesh.computeNormals() )
                if ( _verbose )
                    std::cout << "    . Compute normals" << std::endl;

        if ( mesh.computeTangents() )
            if ( _verbose )
                std::cout << "    . Compute tangents" << std::endl;

        Material* mat = extractMaterial( _model, _model.materials[primitive.material], _scene, _verbose );
        _scene->models[_mesh.name] = new Model(_mesh.name, mesh, mat);
    }
}